

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderPrefix(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) {
    pxVar1 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar1 = reader->curnode;
    }
    if (pxVar1->type - XML_ELEMENT_NODE < 2) {
      if ((pxVar1->ns != (xmlNs *)0x0) && (pxVar2 = pxVar1->ns->prefix, pxVar2 != (xmlChar *)0x0)) {
LAB_00176d6d:
        pxVar2 = xmlStrdup(pxVar2);
        if (pxVar2 != (xmlChar *)0x0) {
          return pxVar2;
        }
        xmlTextReaderErrMemory(reader);
        return (xmlChar *)0x0;
      }
    }
    else if ((pxVar1->type == XML_NAMESPACE_DECL) && (pxVar1->children != (_xmlNode *)0x0)) {
      pxVar2 = "xmlns";
      goto LAB_00176d6d;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderPrefix(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) node;
	if (ns->prefix == NULL)
	    return(NULL);
	return(readerStrdup(reader, BAD_CAST "xmlns"));
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(NULL);
    if ((node->ns != NULL) && (node->ns->prefix != NULL))
	return(readerStrdup(reader, node->ns->prefix));
    return(NULL);
}